

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ManAnalyzeCoDrivers(Gia_Man_t *p,int *pnDrivers,int *pnInverts)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  uint *puVar3;
  bool bVar4;
  Vec_Int_t *vMarks;
  int nInverts;
  int nDrivers;
  int Entry;
  int i;
  Gia_Obj_t *pObj;
  int *pnInverts_local;
  int *pnDrivers_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStart(iVar1);
  vMarks._0_4_ = 0;
  vMarks._4_4_ = 0;
  nDrivers = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar4 = false;
    if (nDrivers < iVar1) {
      _Entry = Gia_ManCo(p,nDrivers);
      bVar4 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjFaninC0(_Entry);
    uVar2 = 1;
    if (iVar1 != 0) {
      uVar2 = 2;
    }
    iVar1 = Gia_ObjFaninId0p(p,_Entry);
    puVar3 = (uint *)Vec_IntEntryP(p_00,iVar1);
    *puVar3 = uVar2 | *puVar3;
    nDrivers = nDrivers + 1;
  }
  for (nDrivers = 0; iVar1 = Vec_IntSize(p_00), nDrivers < iVar1; nDrivers = nDrivers + 1) {
    iVar1 = Vec_IntEntry(p_00,nDrivers);
    vMarks._4_4_ = (uint)(iVar1 != 0) + vMarks._4_4_;
    vMarks._0_4_ = (uint)(iVar1 == 3) + (int)vMarks;
  }
  Vec_IntFree(p_00);
  *pnDrivers = vMarks._4_4_;
  *pnInverts = (int)vMarks;
  return;
}

Assistant:

void Lf_ManAnalyzeCoDrivers( Gia_Man_t * p, int * pnDrivers, int * pnInverts )
{
    Gia_Obj_t * pObj;
    int i, Entry, nDrivers, nInverts;
    Vec_Int_t * vMarks = Vec_IntStart( Gia_ManObjNum(p) );
    nDrivers = nInverts = 0;
    Gia_ManForEachCo( p, pObj, i )
        *Vec_IntEntryP( vMarks, Gia_ObjFaninId0p(p, pObj) ) |= Gia_ObjFaninC0(pObj) ? 2 : 1;
    Vec_IntForEachEntry( vMarks, Entry, i )
        nDrivers += (int)(Entry != 0), nInverts += (int)(Entry == 3);
    Vec_IntFree( vMarks );
    *pnDrivers = nDrivers;
    *pnInverts = nInverts;
}